

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
Gecko::Graph::node_neighbors(Graph *this,Index i)

{
  long in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  Index a;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *neighbor;
  const_reference in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  uint uVar1;
  Index in_stack_ffffffffffffffb4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  undefined4 local_1c;
  
  this_00 = in_RDI;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x127113);
  local_1c = node_begin((Graph *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                        (Index)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  while (uVar1 = local_1c,
        in_stack_ffffffffffffffb4 =
             node_end((Graph *)CONCAT44(in_stack_ffffffffffffffb4,local_1c),
                      (Index)((ulong)in_stack_ffffffffffffffa8 >> 0x20)),
        uVar1 < in_stack_ffffffffffffffb4) {
    in_stack_ffffffffffffffa8 =
         std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RSI + 0x40),
                    (ulong)local_1c);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (this_00,(value_type_conflict *)in_RDI);
    local_1c = local_1c + 1;
  }
  return this_00;
}

Assistant:

std::vector<Node::Index>
Graph::node_neighbors(Node::Index i) const
{
  std::vector<Node::Index> neighbor;
  for (Arc::Index a = node_begin(i); a < node_end(i); a++)
    neighbor.push_back(adj[a]);
  return neighbor;
}